

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmtz.cpp
# Opt level: O1

CVmTimeZone * __thiscall CVmTimeZoneCache::tz_from_hash(CVmTimeZoneCache *this,ZoneHashEntry *entry)

{
  int iVar1;
  undefined4 extraout_var;
  CVmTimeZone *pCVar2;
  ZoneHashEntry *entry_00;
  
  if (entry != (ZoneHashEntry *)0x0) {
    iVar1 = (*(entry->super_CVmHashEntryCI).super_CVmHashEntry._vptr_CVmHashEntry[3])(entry);
    entry_00 = (ZoneHashEntry *)CONCAT44(extraout_var,iVar1);
    if (entry_00->tz == (CVmTimeZone *)0x0) {
      pCVar2 = CVmTimeZone::load(entry_00);
      entry_00->tz = pCVar2;
      if (pCVar2 != (CVmTimeZone *)0x0) {
        entry_00->nxt = this->first_loaded_;
        this->first_loaded_ = entry_00;
      }
    }
    return entry_00->tz;
  }
  return (CVmTimeZone *)0x0;
}

Assistant:

CVmTimeZone *CVmTimeZoneCache::tz_from_hash(VMG_ ZoneHashEntry *entry)
{
    /* if there's no table entry, there's nothing to load */
    if (entry == 0)
        return 0;

    /* resolve links */
    entry = entry->resolve_links();

    /* if we haven't loaded the timezone object yet, do so now */
    if (entry->tz == 0)
    {
        /* load it */
        entry->tz = CVmTimeZone::load(vmg_ entry);

        /* if successful, add it to the loaded zone list */
        if (entry->tz != 0)
        {
            entry->nxt = first_loaded_;
            first_loaded_ = entry;
        }
    }

    /* return the cached object */
    return entry->tz;
}